

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_common.c
# Opt level: O1

adh_node_t * hash_get_value(adh_weight_t weight,adh_order_t order)

{
  adh_node_t *paVar1;
  adh_node_t *paVar2;
  hash_entry_t *phVar3;
  uint uVar4;
  
  uVar4 = (uint)order;
  phVar3 = map_weight_nodes.buckets[weight % 0x1eef];
  if (phVar3 == (hash_entry_t *)0x0) {
    return (adh_node_t *)0x0;
  }
  paVar2 = (adh_node_t *)0x0;
  do {
    paVar1 = phVar3->value;
    if ((paVar1->weight == weight) &&
       (paVar1 != adh_root_node && (ushort)uVar4 < (ushort)*(uint *)&paVar1->order)) {
      paVar2 = paVar1;
      uVar4 = *(uint *)&paVar1->order;
    }
    phVar3 = phVar3->next;
  } while (phVar3 != (hash_entry *)0x0);
  return paVar2;
}

Assistant:

adh_node_t* hash_get_value(adh_weight_t weight, adh_order_t order) {
    adh_node_t* node_result = NULL;
    int hash_index = hash_get_index(weight);
    hash_entry_t* entry = map_weight_nodes.buckets[hash_index];
    while(entry) {
        adh_node_t* current_node = entry->value;

        if(current_node->weight != weight) {
#ifdef _DEBUG
            collision++;
            hash_check_collision(weight, hash_index, current_node);
#endif
        }
        else if(current_node->order > order && current_node != adh_root_node) {
            node_result = current_node;
            order = node_result->order;
        }
        entry = entry->next;
    }
    return node_result;
}